

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,1>::accumulateDerivativesDispatch2<true,true>
          (BeagleCPUImpl<double,1,1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  if (outSumSquaredDerivatives == (double *)0x0) {
    accumulateDerivativesImpl<true,true,false>(this,outDerivatives,outSumDerivatives,(double *)0x0);
    return;
  }
  accumulateDerivativesImpl<true,true,true>
            (this,outDerivatives,outSumDerivatives,outSumSquaredDerivatives);
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}